

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZGeoCube>::Read
          (TPZGeoElRefLess<pzgeom::TPZGeoCube> *this,TPZStream *buf,void *context)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  TPZStream *in_RDI;
  void *unaff_retaddr;
  TPZStream *in_stack_00000008;
  uint i;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  uint uVar1;
  
  TPZGeoEl::Read((TPZGeoEl *)context,in_stack_00000008,unaff_retaddr);
  pzgeom::TPZGeoCube::Read
            ((TPZGeoCube *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),in_RDI,
             (void *)0x15e66a2);
  for (uVar1 = 0; uVar1 < 0x1b; uVar1 = uVar1 + 1) {
    (*in_RDI[(ulong)uVar1 * 3 + 0x11]._vptr_TPZStream[6])
              (in_RDI + (ulong)uVar1 * 3 + 0x11,in_RSI,in_RDX);
  }
  return;
}

Assistant:

void TPZGeoElRefLess<TGeo>::Read(TPZStream &buf, void *context){
    TPZGeoEl::Read(buf,context);
    fGeo.Read(buf,context);
    for (unsigned int i = 0; i < TGeo::NSides; ++i) {
        this->fNeighbours[i].Read(buf, context);
    }
}